

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_0::CopySSBOToImageTest::initPrograms
          (CopySSBOToImageTest *this,SourceCollections *sourceCollections)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ProgramSources *this_00;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  SourceCollections *sourceCollections_local;
  CopySSBOToImageTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  poVar3 = std::operator<<(poVar3,"layout (local_size_x = ");
  iVar1 = tcu::Vector<int,_2>::x(&this->m_localSize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,", local_size_y = ");
  iVar1 = tcu::Vector<int,_2>::y(&this->m_localSize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,") in;\n");
  poVar3 = std::operator<<(poVar3,
                           "layout(binding = 1, r32ui) writeonly uniform highp uimage2D u_dstImg;\n"
                          );
  poVar3 = std::operator<<(poVar3,"layout(binding = 0) readonly buffer Input {\n");
  poVar3 = std::operator<<(poVar3,"    uint values[");
  iVar1 = tcu::Vector<int,_2>::x(&this->m_imageSize);
  iVar2 = tcu::Vector<int,_2>::y(&this->m_imageSize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1 * iVar2);
  poVar3 = std::operator<<(poVar3,"];\n");
  poVar3 = std::operator<<(poVar3,"} sb_in;\n\n");
  poVar3 = std::operator<<(poVar3,"void main (void) {\n");
  poVar3 = std::operator<<(poVar3,"    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n");
  poVar3 = std::operator<<(poVar3,
                           "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
                          );
  poVar3 = std::operator<<(poVar3,
                           "    imageStore(u_dstImg, ivec2(gl_GlobalInvocationID.xy), uvec4(value, 0, 0, 0));\n"
                          );
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"comp",&local_1c1);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(this_00,&local_1f0);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void CopySSBOToImageTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ") in;\n"
		<< "layout(binding = 1, r32ui) writeonly uniform highp uimage2D u_dstImg;\n"
		<< "layout(binding = 0) readonly buffer Input {\n"
		<< "    uint values[" << (m_imageSize.x() * m_imageSize.y()) << "];\n"
		<< "} sb_in;\n\n"
		<< "void main (void) {\n"
		<< "    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
		<< "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
		<< "    imageStore(u_dstImg, ivec2(gl_GlobalInvocationID.xy), uvec4(value, 0, 0, 0));\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}